

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  Ast pre_eval;
  Ast post_eval;
  istream *local_48;
  Parse_ast parse;
  
  get_program((int)&local_48,(char **)(ulong)(uint)argc);
  lambda::parse_from(&parse,local_48);
  poVar1 = std::operator<<((ostream *)&std::cout,"parse: ");
  poVar1 = lambda::operator<<(poVar1,&parse);
  std::operator<<(poVar1,"\n\n");
  lambda::reduce((lambda *)&pre_eval,&parse);
  poVar1 = std::operator<<((ostream *)&std::cout,"typed: ");
  poVar1 = lambda::operator<<(poVar1,&pre_eval);
  std::operator<<(poVar1,"\n\n");
  lambda::eval((lambda *)&post_eval,&pre_eval);
  poVar1 = std::operator<<((ostream *)&std::cout,"eval\'d: ");
  poVar1 = lambda::operator<<(poVar1,&post_eval);
  std::operator<<(poVar1,'\n');
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&post_eval.underlying_.
              super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pre_eval.underlying_.
              super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__detail::__variant::
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  ::~_Variant_storage((_Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                       *)&parse);
  (**(code **)(*(long *)local_48 + 8))(local_48);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  auto file = get_program(argc, argv);

  auto parse = [&] {
    try {
      return lambda::parse_from(*file);
    } catch (lambda::Parse_error const& e) {
      ublib::failwith(e);
    }
  }();

  std::cout << "parse: " << parse << "\n\n";

  auto const pre_eval = lambda::reduce(parse);
  std::cout << "typed: " << pre_eval << "\n\n";   

  auto const post_eval = eval(pre_eval);
  std::cout << "eval'd: " << post_eval << '\n';
}